

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O0

void __thiscall
ViconCGStreamClientSDK::VCGClient::ReceiveMulticastData
          (VCGClient *this,string *i_MulticastIPAddress,string *i_LocalIPAddress,
          unsigned_short i_Port)

{
  bool bVar1;
  reference psVar2;
  element_type *this_00;
  string local_b0;
  string local_80;
  undefined1 local_60 [8];
  shared_ptr<VViconCGStreamClient> pClient;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  *__range1;
  scoped_lock Lock;
  unsigned_short i_Port_local;
  string *i_LocalIPAddress_local;
  string *i_MulticastIPAddress_local;
  VCGClient *this_local;
  
  Lock._14_2_ = i_Port;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)&__range1,&this->m_ClientMutex);
  __end1 = std::
           vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
           ::begin(&this->m_pClients);
  pClient.super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
       ::end(&this->m_pClients);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
                                *)&pClient.
                                   super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<VViconCGStreamClient>::shared_ptr
              ((shared_ptr<VViconCGStreamClient> *)local_60,psVar2);
    this_00 = std::
              __shared_ptr_access<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_60);
    std::__cxx11::string::string((string *)&local_80,(string *)i_MulticastIPAddress);
    std::__cxx11::string::string((string *)&local_b0,(string *)i_LocalIPAddress);
    VViconCGStreamClient::ReceiveMulticastData(this_00,&local_80,&local_b0,Lock._14_2_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_80);
    std::shared_ptr<VViconCGStreamClient>::~shared_ptr((shared_ptr<VViconCGStreamClient> *)local_60)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<VViconCGStreamClient>_*,_std::vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::
          vector<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
          ::empty(&this->m_pClients);
  this->m_bMulticastReceiving = (bool)((bVar1 ^ 0xffU) & 1);
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)&__range1);
  return;
}

Assistant:

void VCGClient::ReceiveMulticastData( std::string i_MulticastIPAddress, std::string i_LocalIPAddress, unsigned short i_Port )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  for (auto pClient : m_pClients)
  {
    pClient->ReceiveMulticastData(i_MulticastIPAddress, i_LocalIPAddress, i_Port);
  }

  m_bMulticastReceiving = !m_pClients.empty();
}